

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__4,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  Arg *in_R9;
  string_view format;
  Arg local_78;
  Arg local_48;
  
  substitute_internal::Arg::Arg(&local_48,*(int *)(*(long *)this + 0x4c));
  local_78.piece_._M_len = (size_t)**(ushort **)(**(long **)(this + 8) + 0x10);
  local_78.piece_._M_str =
       (char *)(~local_78.piece_._M_len + (long)*(ushort **)(**(long **)(this + 8) + 0x10));
  format._M_str = (char *)&local_48;
  format._M_len = (size_t)"FieldDescriptorProto.oneof_index $0 is out of range for type \"$1\".";
  Substitute_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)0x42,format,&local_78,in_R9);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}